

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

string * __thiscall
soul::AST::Scope::makeUniqueName(string *__return_storage_ptr__,Scope *this,string *root)

{
  bool bVar1;
  int __val;
  anon_class_8_1_8991fb9c local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.this = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)root);
  __val = 2;
  while( true ) {
    bVar1 = makeUniqueName::anon_class_8_1_8991fb9c::operator()(&local_98,__return_storage_ptr__);
    if (!bVar1) break;
    std::operator+(&local_70,root,"_");
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    __val = __val + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeUniqueName (const std::string& root) const
        {
            return addSuffixToMakeUnique (root,
                                          [this] (const std::string& name)
                                          {
                                              for (auto& f : getFunctions())
                                                  if (f->name == name)
                                                      return true;

                                              for (auto& s : getStructDeclarations())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& u : getUsingDeclarations())
                                                  if (u->name == name)
                                                      return true;

                                              for (auto& s : getSubModules())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& a : getProcessorAliases())
                                                  if (a->name == name)
                                                      return true;

                                              for (auto& p : getProcessorInstances())
                                                  if (p->instanceName->toString() == name)
                                                      return true;

                                              return false;
                                          });
        }